

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O2

bool CheckCheatmode(bool printmsg)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = G_SkillProperty(SKILLP_DisableCheats);
  if (((iVar2 == 0) && (netgame == false)) && (deathmatch.Value == 0)) {
    bVar1 = 0;
  }
  else if (printmsg && sv_cheats.Value == false) {
    Printf("sv_cheats must be true to enable this command.\n");
    bVar1 = 1;
  }
  else {
    bVar1 = sv_cheats.Value ^ 1;
  }
  return (bool)bVar1;
}

Assistant:

bool CheckCheatmode (bool printmsg)
{
	if ((G_SkillProperty(SKILLP_DisableCheats) || netgame || deathmatch) && (!sv_cheats))
	{
		if (printmsg) Printf ("sv_cheats must be true to enable this command.\n");
		return true;
	}
	else
	{
		return false;
	}
}